

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  uint32_t uVar4;
  uint32_t uVar5;
  ostream *poVar6;
  uint32_t local_2d0;
  uint j_1;
  uint32_t objectsOnElevation;
  uint i_5;
  uint32_t objectsTotal;
  uint32_t v;
  uint32_t PID;
  unsigned_short j;
  uint check;
  uint uStack_2a8;
  short loop;
  uint32_t count;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  uint32_t globalVars;
  uint32_t elevations;
  uint32_t flags;
  uint32_t localVars;
  ifstream in;
  allocator local_71;
  string local_70 [8];
  string filename;
  allocator local_39;
  string local_38 [32];
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  if (argc == 2) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,pcVar1,&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::ifstream::ifstream(&localVars);
    _Var3 = std::__cxx11::string::c_str();
    std::operator|(_S_bin,_S_in);
    std::ifstream::open((char *)&localVars,_Var3);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Can\'t open file: ");
      poVar6 = std::operator<<(poVar6,local_70);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
    }
    else {
      readUINT32((ifstream *)&localVars);
      readUINT32((ifstream *)&localVars);
      readUINT32((ifstream *)&localVars);
      readUINT32((ifstream *)&localVars);
      readUINT32((ifstream *)&localVars);
      readUINT32((ifstream *)&localVars);
      readUINT32((ifstream *)&localVars);
      readUINT32((ifstream *)&localVars);
      uVar4 = readUINT32((ifstream *)&localVars);
      readUINT32((ifstream *)&localVars);
      uVar5 = readUINT32((ifstream *)&localVars);
      i = (uint)((uVar5 & 2) == 0);
      if ((uVar5 & 4) == 0) {
        i = i + 1;
      }
      if ((uVar5 & 8) == 0) {
        i = i + 1;
      }
      readUINT32((ifstream *)&localVars);
      uVar5 = readUINT32((ifstream *)&localVars);
      readUINT32((ifstream *)&localVars);
      readUINT32((ifstream *)&localVars);
      for (i_2 = 0; i_2 != 0x2c; i_2 = i_2 + 1) {
        readUINT32((ifstream *)&localVars);
      }
      for (i_3 = 0; i_3 != uVar5; i_3 = i_3 + 1) {
        readUINT32((ifstream *)&localVars);
      }
      for (i_4 = 0; i_4 != uVar4; i_4 = i_4 + 1) {
        readUINT32((ifstream *)&localVars);
      }
      for (count = 0; count != i * 10000; count = count + 1) {
        readUINT32((ifstream *)&localVars);
      }
      for (uStack_2a8 = 0; uStack_2a8 < 5; uStack_2a8 = uStack_2a8 + 1) {
        uVar4 = readUINT32((ifstream *)&localVars);
        if (uVar4 != 0) {
          j = (unsigned_short)uVar4;
          if ((uVar4 & 0xf) != 0) {
            j = j + (0x10 - (j & 0xf));
          }
          PID = 0;
          for (v._2_2_ = 0; (int)(uint)v._2_2_ < (int)(short)j; v._2_2_ = v._2_2_ + 1) {
            uVar5 = readUINT32((ifstream *)&localVars);
            readUINT32((ifstream *)&localVars);
            if (uVar5 >> 0x18 == 1) {
              readUINT32((ifstream *)&localVars);
              readUINT32((ifstream *)&localVars);
            }
            else if (uVar5 >> 0x18 == 2) {
              readUINT32((ifstream *)&localVars);
            }
            readUINT32((ifstream *)&localVars);
            readUINT32((ifstream *)&localVars);
            readUINT32((ifstream *)&localVars);
            readUINT32((ifstream *)&localVars);
            readUINT32((ifstream *)&localVars);
            readUINT32((ifstream *)&localVars);
            readUINT32((ifstream *)&localVars);
            readUINT32((ifstream *)&localVars);
            readUINT32((ifstream *)&localVars);
            readUINT32((ifstream *)&localVars);
            readUINT32((ifstream *)&localVars);
            readUINT32((ifstream *)&localVars);
            readUINT32((ifstream *)&localVars);
            readUINT32((ifstream *)&localVars);
            if ((uint)v._2_2_ % 0x10 == 0xf) {
              uVar5 = readUINT32((ifstream *)&localVars);
              PID = PID + uVar5;
              readUINT32((ifstream *)&localVars);
            }
          }
          if (PID != uVar4) {
            poVar6 = std::operator<<((ostream *)&std::cout,"Check error!");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            argv_local._4_4_ = 1;
            goto LAB_001050de;
          }
        }
      }
      readUINT32((ifstream *)&localVars);
      for (j_1 = 0; j_1 != i; j_1 = j_1 + 1) {
        uVar4 = readUINT32((ifstream *)&localVars);
        for (local_2d0 = 0; local_2d0 != uVar4; local_2d0 = local_2d0 + 1) {
          readObject((ifstream *)&localVars);
        }
      }
      std::ifstream::close();
      argv_local._4_4_ = 0;
    }
LAB_001050de:
    std::ifstream::~ifstream(&localVars);
    std::__cxx11::string::~string(local_70);
  }
  else {
    pcVar1 = *argv;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    usage((string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        usage(argv[0]);
        return 1;
    }

    std::string filename = argv[1];
    std::ifstream in;

    in.open(filename.c_str(), std::ios_base::binary | std::ios_base::in);
    if (!in.is_open())
    {
        std::cout << "Can't open file: " << filename << std::endl;
        return 1;
    }

    // 4 - version
    readUINT32(in);
    // 16 - name
    readUINT32(in);
    readUINT32(in);
    readUINT32(in);
    readUINT32(in);
    // 4 - default position
    readUINT32(in);
    // 4 - default elevation
    readUINT32(in);
    // 4 - default orientation
    readUINT32(in);
    // 4 - local vars
    uint32_t localVars = readUINT32(in);
    // 4 - SID
    readUINT32(in);
    // 4 - flags
    uint32_t flags = readUINT32(in);
    // 4 - elevations
    uint32_t elevations = 0;
    if ((flags & 2) == 0) elevations++;
    if ((flags & 4) == 0) elevations++;
    if ((flags & 8) == 0) elevations++;

    // 4 - unknown
    readUINT32(in);
    // 4 - global vars
    uint32_t globalVars = readUINT32(in);
    // 4 - map id
    readUINT32(in);
    // 4 - time
    readUINT32(in);
    // 4*44 - unknown
    for (unsigned i = 0; i != 44; ++i) readUINT32(in);
    // 4 * NUM-GLOBAL-VARS
    for (unsigned i = 0; i != globalVars; ++i) readUINT32(in);
    // 4 * NUM-LOCAL-VARS
    for (unsigned i = 0; i != localVars; ++i) readUINT32(in);
    // 100*100 * 2 * 2 * elevations  - tiles
    for (unsigned i = 0; i != 100*100*elevations; ++i) readUINT32(in);

    // SCRIPTS SECTION
    for (unsigned int i = 0; i < 5; i++)
    {
        uint32_t count = readUINT32(in);
        if (count > 0)
        {
            short loop = count;
            if (count%16 > 0 ) loop += 16 - count%16;

            unsigned int check = 0;
            for (unsigned short j = 0; j < loop; j++)
            {
                {
                    uint32_t PID = readUINT32(in);

                    readUINT32(in); // unknown1

                    switch ((PID & 0xFF000000) >> 24)
                    {
                        case 1:
                            readUINT32(in); //unknown 2
                            readUINT32(in); //unknown 3
                            break;
                        case 2:
                            readUINT32(in); //unknown 2
                            break;
                        default:
                            break;
                    }
                    readUINT32(in); //unknown 4
                    readUINT32(in); // scriptId
                    readUINT32(in); //unknown 5
                    readUINT32(in); //unknown 6
                    readUINT32(in); //unknown 7
                    readUINT32(in); //unknown 8
                    readUINT32(in); //unknown 9
                    readUINT32(in); //unknown 10
                    readUINT32(in); //unknown 11
                    readUINT32(in); //unknown 12
                    readUINT32(in); //unknown 13
                    readUINT32(in); //unknown 14
                    readUINT32(in); //unknown 15
                    readUINT32(in); //unknown 16

                    if (j < count)
                    {
                        //std::cout << "Map script: 0x" << std::hex << script->PID() << std::endl;
                    }

                }
                if ((j % 16) == 15)
                {
                    uint32_t v = readUINT32(in);
                    check += v;

                    readUINT32(in); // skip 4
                }
            }
            if (check != count)
            {
                std::cout << "Check error!" << std::endl;
                return 1;
            }
        }
    }

    // OBJECTS section
    uint32_t objectsTotal = readUINT32(in);

    //std::cout << "Objects: " << objectsTotal << std::endl;

    for (unsigned int i = 0; i != elevations; ++i)
        {
            uint32_t objectsOnElevation = readUINT32(in);
            for (unsigned int j = 0; j != objectsOnElevation; ++j)
            {
                readObject(in);
            }
        }


    in.close();
    return 0;
}